

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::RenderTextClipped
               (ImVec2 *pos_min,ImVec2 *pos_max,char *text,char *text_end,ImVec2 *text_size_if_known
               ,ImVec2 *align,ImRect *clip_rect)

{
  bool bVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  ImGuiContext *pIVar7;
  ImU32 col;
  char *pcVar8;
  ImVec2 *pIVar9;
  ImGuiContext *g;
  ImGuiWindow *pIVar10;
  ImFont *font;
  char *pcVar11;
  char *pcVar12;
  ImDrawList *this;
  uint uVar13;
  ImVec2 IVar14;
  float fVar15;
  ImVec4 fine_clip_rect;
  ImVec4 *cpu_fine_clip_rect;
  ImVec2 local_70;
  ImVec2 *local_68;
  ImGuiWindow *local_60;
  ImVec4 local_58;
  ImVec2 local_40;
  float local_38;
  float local_34;
  
  pIVar7 = GImGui;
  pcVar8 = (char *)(-(ulong)(text_end == (char *)0x0) | (ulong)text_end);
  pcVar12 = text;
  pcVar11 = text;
  if (text < pcVar8) {
    do {
      pcVar12 = pcVar11;
      if (*pcVar11 == '#') {
        if (pcVar11[1] == '#') break;
      }
      else if (*pcVar11 == '\0') break;
      pcVar11 = pcVar11 + 1;
      pcVar12 = pcVar8;
    } while (pcVar11 != pcVar8);
  }
  if ((int)pcVar12 != (int)text) {
    pIVar10 = GImGui->CurrentWindow;
    pIVar10->Accessed = true;
    local_70 = *pos_min;
    if (text_size_if_known == (ImVec2 *)0x0) {
      local_68 = pos_max;
      local_60 = pIVar10;
      IVar14 = CalcTextSize(text,pcVar12,false,0.0);
      pos_max = local_68;
      pIVar10 = local_60;
    }
    else {
      IVar14 = *text_size_if_known;
    }
    if (clip_rect != (ImRect *)0x0) {
      pos_min = &clip_rect->Min;
    }
    pIVar9 = &clip_rect->Max;
    if (clip_rect == (ImRect *)0x0) {
      pIVar9 = pos_max;
    }
    bVar1 = true;
    if (local_70.x + IVar14.x < pIVar9->x) {
      bVar1 = pIVar9->y <= local_70.y + IVar14.y;
    }
    if (clip_rect != (ImRect *)0x0) {
      bVar2 = true;
      if ((((ImRect *)pos_min)->Min).x <= local_70.x) {
        bVar2 = local_70.y < (((ImRect *)pos_min)->Min).y;
      }
      bVar1 = (bool)(bVar1 | bVar2);
    }
    if (0.0 < align->x) {
      fVar15 = ((pos_max->x - local_70.x) - IVar14.x) * align->x + local_70.x;
      uVar13 = -(uint)(fVar15 <= local_70.x);
      local_70.x = (float)(uVar13 & (uint)local_70.x | ~uVar13 & (uint)fVar15);
    }
    if (0.0 < align->y) {
      fVar15 = ((pos_max->y - local_70.y) - IVar14.y) * align->y + local_70.y;
      uVar13 = -(uint)(fVar15 <= local_70.y);
      local_70.y = (float)(uVar13 & (uint)local_70.y | ~uVar13 & (uint)fVar15);
    }
    if (bVar1) {
      local_40 = ((ImRect *)pos_min)->Min;
      local_34 = pIVar9->y;
      cpu_fine_clip_rect = (ImVec4 *)&local_40;
      this = pIVar10->DrawList;
      font = pIVar7->Font;
      local_68 = (ImVec2 *)CONCAT44(local_68._4_4_,pIVar7->FontSize);
      local_58.x = (GImGui->Style).Colors[0].x;
      local_58.y = (GImGui->Style).Colors[0].y;
      uVar3 = (GImGui->Style).Colors[0].z;
      uVar4 = (GImGui->Style).Colors[0].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar4;
      local_58.z = (float)uVar3;
      local_38 = pIVar9->x;
      col = ColorConvertFloat4ToU32(&local_58);
    }
    else {
      this = pIVar10->DrawList;
      font = pIVar7->Font;
      local_68 = (ImVec2 *)CONCAT44(local_68._4_4_,pIVar7->FontSize);
      local_58.x = (GImGui->Style).Colors[0].x;
      local_58.y = (GImGui->Style).Colors[0].y;
      uVar5 = (GImGui->Style).Colors[0].z;
      uVar6 = (GImGui->Style).Colors[0].w;
      local_58.w = (GImGui->Style).Alpha * (float)uVar6;
      local_58.z = (float)uVar5;
      col = ColorConvertFloat4ToU32(&local_58);
      cpu_fine_clip_rect = (ImVec4 *)0x0;
    }
    ImDrawList::AddText(this,font,local_68._0_4_,&local_70,col,text,pcVar12,0.0,cpu_fine_clip_rect);
    if (pIVar7->LogEnabled == true) {
      LogRenderedText(&local_70,text,pcVar12);
    }
  }
  return;
}

Assistant:

void ImGui::RenderTextClipped(const ImVec2& pos_min, const ImVec2& pos_max, const char* text, const char* text_end, const ImVec2* text_size_if_known, const ImVec2& align, const ImRect* clip_rect)
{
    // Hide anything after a '##' string
    const char* text_display_end = FindRenderedTextEnd(text, text_end);
    const int text_len = (int)(text_display_end - text);
    if (text_len == 0)
        return;

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();

    // Perform CPU side clipping for single clipped element to avoid using scissor state
    ImVec2 pos = pos_min;
    const ImVec2 text_size = text_size_if_known ? *text_size_if_known : CalcTextSize(text, text_display_end, false, 0.0f);

    const ImVec2* clip_min = clip_rect ? &clip_rect->Min : &pos_min;
    const ImVec2* clip_max = clip_rect ? &clip_rect->Max : &pos_max;
    bool need_clipping = (pos.x + text_size.x >= clip_max->x) || (pos.y + text_size.y >= clip_max->y);
    if (clip_rect) // If we had no explicit clipping rectangle then pos==clip_min
        need_clipping |= (pos.x < clip_min->x) || (pos.y < clip_min->y);

    // Align whole block. We should defer that to the better rendering function when we'll have support for individual line alignment.
    if (align.x > 0.0f) pos.x = ImMax(pos.x, pos.x + (pos_max.x - pos.x - text_size.x) * align.x);
    if (align.y > 0.0f) pos.y = ImMax(pos.y, pos.y + (pos_max.y - pos.y - text_size.y) * align.y);

    // Render
    if (need_clipping)
    {
        ImVec4 fine_clip_rect(clip_min->x, clip_min->y, clip_max->x, clip_max->y);
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, &fine_clip_rect);
    }
    else
    {
        window->DrawList->AddText(g.Font, g.FontSize, pos, GetColorU32(ImGuiCol_Text), text, text_display_end, 0.0f, NULL);
    }
    if (g.LogEnabled)
        LogRenderedText(pos, text, text_display_end);
}